

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O0

RK_S16 resolve_divisor(RK_U32 d,RK_S16 *shift)

{
  RK_U16 RVar1;
  RK_S32 RVar2;
  int iVar3;
  uint local_20;
  RK_S32 f;
  RK_S32 e;
  RK_S16 *shift_local;
  RK_U32 d_local;
  
  RVar2 = mpp_log2(d);
  *shift = (RK_S16)RVar2;
  iVar3 = d - (1 << ((byte)*shift & 0x1f));
  if (*shift < 9) {
    local_20 = iVar3 << (8U - (char)*shift & 0x1f);
  }
  else {
    RVar1 = round_two((long)iVar3,*shift - 8);
    local_20 = (uint)RVar1;
  }
  *shift = *shift + 0xe;
  return div_lut[(int)local_20];
}

Assistant:

static RK_S16 resolve_divisor(RK_U32 d, RK_S16 *shift)
{
    RK_S32 e, f;

    *shift = mpp_log2(d);
    e = d - (1 << (*shift));
    if (*shift > AV1_DIV_LUT_BITS)
        f = round_two(e, *shift - AV1_DIV_LUT_BITS);
    else
        f = e << (AV1_DIV_LUT_BITS - (*shift));

    *shift += AV1_DIV_LUT_PREC_BITS;

    return div_lut[f];
}